

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

const_iterator __thiscall
libcellml::Importer::ImporterImpl::findImportSource
          (ImporterImpl *this,ImportSourcePtr *importSource)

{
  shared_ptr<libcellml::ImportSource> *psVar1;
  bool bVar2;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  __it;
  long lVar3;
  long lVar4;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  _Var5;
  __shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  __it._M_current =
       (this->mImports).
       super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->mImports).
           super__Vector_base<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &importSource->super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&local_60);
  std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&local_50);
  std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&local_40);
  lVar4 = (long)psVar1 - (long)__it._M_current;
  for (lVar3 = lVar4 >> 6; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)&local_70,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_001ec990;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)&local_70,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001ec990;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)&local_70,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001ec990;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)&local_70,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001ec990;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = psVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
                  ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                                *)&local_70,__it), _Var5._M_current = __it._M_current, bVar2))
      goto LAB_001ec990;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                          *)&local_70,__it);
    _Var5._M_current = __it._M_current;
    if (bVar2) goto LAB_001ec990;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::$_0>
          ::operator()((_Iter_pred<libcellml::Importer::ImporterImpl::findImportSource(std::shared_ptr<libcellml::ImportSource>const&)const::__0>
                        *)&local_70,__it);
  _Var5._M_current = psVar1;
  if (bVar2) {
    _Var5._M_current = __it._M_current;
  }
LAB_001ec990:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return (const_iterator)_Var5._M_current;
}

Assistant:

bool Importer::addModel(const ModelPtr &model, const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) != 0) {
        // If the key already exists in the library, do nothing.
        return false;
    }
    pFunc()->mLibrary.insert(std::make_pair(normalisedKey, model));
    return true;
}